

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O0

void __thiscall HighsNodeQueue::clear(HighsNodeQueue *this)

{
  priority_queue<long,_std::vector<long,_std::allocator<long>_>,_std::greater<long>_> *in_RDI;
  HighsNodeQueue nodequeue;
  bool original;
  HighsNodeQueue *this_00;
  vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
  *in_stack_ffffffffffffff48;
  vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
  *in_stack_ffffffffffffff50;
  HighsNodeQueue *in_stack_ffffffffffffff60;
  HighsInt in_stack_ffffffffffffff6c;
  HighsNodeQueue *in_stack_ffffffffffffff70;
  pointer local_58;
  int64_t local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  int64_t local_30;
  pointer local_28;
  pointer local_20;
  HighsInt local_18;
  
  this_00 = (HighsNodeQueue *)&stack0xffffffffffffff58;
  HighsNodeQueue(in_stack_ffffffffffffff60);
  setNumCol(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::operator=
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::
  unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
  ::operator=((unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
               *)this_00,
              (unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
               *)in_RDI);
  std::
  unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
  ::operator=((unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
               *)this_00,
              (unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
               *)in_RDI);
  std::priority_queue<long,_std::vector<long,_std::allocator<long>_>,_std::greater<long>_>::
  operator=((priority_queue<long,_std::vector<long,_std::allocator<long>_>,_std::greater<long>_> *)
            this_00,in_RDI);
  std::
  unique_ptr<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>::
  operator=(&this_00->allocatorState,
            (unique_ptr<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
             *)in_RDI);
  in_RDI[2].c.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_58;
  *(int64_t *)&in_RDI[2].field_0x18 = local_50;
  in_RDI[3].c.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = local_48;
  in_RDI[3].c.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_40;
  in_RDI[3].c.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_38;
  *(int64_t *)&in_RDI[3].field_0x18 = local_30;
  in_RDI[4].c.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = local_28;
  in_RDI[4].c.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_20;
  *(HighsInt *)
   &in_RDI[4].c.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_18;
  ~HighsNodeQueue(this_00);
  return;
}

Assistant:

void HighsNodeQueue::clear() {
  const bool original = false;
  HighsNodeQueue nodequeue;
  nodequeue.setNumCol(numCol);
  if (original) {
    *this = std::move(nodequeue);
  } else {
    (*this).nodes = std::move(nodequeue.nodes);
    (*this).colLowerNodesPtr = std::move(nodequeue.colLowerNodesPtr);
    (*this).colUpperNodesPtr = std::move(nodequeue.colUpperNodesPtr);
    (*this).freeslots = std::move(nodequeue.freeslots);
    (*this).allocatorState = std::move(nodequeue.allocatorState);
    (*this).lowerRoot = nodequeue.lowerRoot;
    (*this).lowerMin = nodequeue.lowerMin;
    (*this).hybridEstimRoot = nodequeue.hybridEstimRoot;
    (*this).hybridEstimMin = nodequeue.hybridEstimMin;
    (*this).suboptimalRoot = nodequeue.suboptimalRoot;
    (*this).suboptimalMin = nodequeue.suboptimalMin;
    (*this).numSuboptimal = nodequeue.numSuboptimal;
    (*this).optimality_limit = nodequeue.optimality_limit;
    (*this).numCol = nodequeue.numCol;
  }
}